

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

Resource res_findResource_63(ResourceData *pResData,Resource r,char **path,char **key)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  bool local_5b;
  uint local_58;
  int32_t local_54;
  UResType type;
  int32_t indexR;
  Resource t2;
  Resource t1;
  char *closeIndex;
  char *nextSepP;
  char *pathP;
  char **key_local;
  char **path_local;
  ResourceData *pRStack_18;
  Resource r_local;
  ResourceData *pResData_local;
  
  nextSepP = *path;
  closeIndex = *path;
  _t2 = (char *)0x0;
  local_54 = 0;
  local_58 = r >> 0x1c;
  indexR = r;
  pathP = (char *)key;
  key_local = path;
  path_local._4_4_ = r;
  pRStack_18 = pResData;
  sVar1 = strlen(nextSepP);
  if (sVar1 == 0) {
    pResData_local._4_4_ = path_local._4_4_;
  }
  else {
    if ((((local_58 == 2) || (local_58 == 5)) || (local_58 == 4)) ||
       ((local_58 == 8 || (local_58 == 9)))) {
      while( true ) {
        local_5b = false;
        if ((((closeIndex != (char *)0x0) &&
             ((local_5b = false, *nextSepP != '\0' && (local_5b = false, indexR != -1)))) &&
            (local_5b = true, local_58 != 2)) &&
           ((local_5b = true, local_58 != 5 && (local_5b = true, local_58 != 4)))) {
          local_5b = local_58 == 8 || local_58 == 9;
        }
        if (!local_5b) break;
        closeIndex = strchr(nextSepP,0x2f);
        if (closeIndex == (char *)0x0) {
          pcVar2 = strchr(nextSepP,0);
          *key_local = pcVar2;
        }
        else {
          if (closeIndex == nextSepP) {
            return 0xffffffff;
          }
          *closeIndex = '\0';
          *key_local = closeIndex + 1;
        }
        if (((local_58 == 2) || (local_58 == 5)) || (local_58 == 4)) {
          *(char **)pathP = nextSepP;
          type = res_getTableItemByKey_63(pRStack_18,indexR,&local_54,(char **)pathP);
          if (type == RES_NONE) {
            lVar3 = strtol(nextSepP,(char **)&t2,10);
            local_54 = (int32_t)lVar3;
            if ((-1 < local_54) && (*_t2 == '\0')) {
              type = res_getTableItemByIndex_63(pRStack_18,indexR,local_54,(char **)pathP);
            }
          }
        }
        else if ((local_58 == 8) || (local_58 == 9)) {
          lVar3 = strtol(nextSepP,(char **)&t2,10);
          local_54 = (int32_t)lVar3;
          if ((local_54 < 0) || (*_t2 != '\0')) {
            type = RES_NONE;
          }
          else {
            type = res_getArrayItem_63(pRStack_18,indexR,local_54);
          }
          pathP[0] = '\0';
          pathP[1] = '\0';
          pathP[2] = '\0';
          pathP[3] = '\0';
          pathP[4] = '\0';
          pathP[5] = '\0';
          pathP[6] = '\0';
          pathP[7] = '\0';
        }
        else {
          type = RES_NONE;
        }
        indexR = type;
        local_58 = (uint)type >> 0x1c;
        nextSepP = *key_local;
      }
      return indexR;
    }
    pResData_local._4_4_ = 0xffffffff;
  }
  return pResData_local._4_4_;
}

Assistant:

U_CFUNC Resource
res_findResource(const ResourceData *pResData, Resource r, char** path, const char** key) {
  char *pathP = *path, *nextSepP = *path;
  char *closeIndex = NULL;
  Resource t1 = r;
  Resource t2;
  int32_t indexR = 0;
  UResType type = (UResType)RES_GET_TYPE(t1);

  /* if you come in with an empty path, you'll be getting back the same resource */
  if(!uprv_strlen(pathP)) {
      return r;
  }

  /* one needs to have an aggregate resource in order to search in it */
  if(!URES_IS_CONTAINER(type)) {
      return RES_BOGUS;
  }
  
  while(nextSepP && *pathP && t1 != RES_BOGUS && URES_IS_CONTAINER(type)) {
    /* Iteration stops if: the path has been consumed, we found a non-existing
     * resource (t1 == RES_BOGUS) or we found a scalar resource (including alias)
     */
    nextSepP = uprv_strchr(pathP, RES_PATH_SEPARATOR);
    /* if there are more separators, terminate string 
     * and set path to the remaining part of the string
     */
    if(nextSepP != NULL) {
      if(nextSepP == pathP) {
        // Empty key string.
        return RES_BOGUS;
      }
      *nextSepP = 0; /* overwrite the separator with a NUL to terminate the key */
      *path = nextSepP+1;
    } else {
      *path = uprv_strchr(pathP, 0);
    }

    /* if the resource is a table */
    /* try the key based access */
    if(URES_IS_TABLE(type)) {
      *key = pathP;
      t2 = res_getTableItemByKey(pResData, t1, &indexR, key);
      if(t2 == RES_BOGUS) { 
        /* if we fail to get the resource by key, maybe we got an index */
        indexR = uprv_strtol(pathP, &closeIndex, 10);
        if(indexR >= 0 && *closeIndex == 0) {
          /* if we indeed have an index, try to get the item by index */
          t2 = res_getTableItemByIndex(pResData, t1, indexR, key);
        } // else t2 is already RES_BOGUS
      }
    } else if(URES_IS_ARRAY(type)) {
      indexR = uprv_strtol(pathP, &closeIndex, 10);
      if(indexR >= 0 && *closeIndex == 0) {
        t2 = res_getArrayItem(pResData, t1, indexR);
      } else {
        t2 = RES_BOGUS; /* have an array, but don't have a valid index */
      }
      *key = NULL;
    } else { /* can't do much here, except setting t2 to bogus */
      t2 = RES_BOGUS;
    }
    t1 = t2;
    type = (UResType)RES_GET_TYPE(t1);
    /* position pathP to next resource key/index */
    pathP = *path;
  }

  return t1;
}